

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

int __thiscall
asl::Array<char>::clone
          (Array<char> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Array(this,*(char **)__fn,*(int *)(*(char **)__fn + -0x10));
  return (int)this;
}

Assistant:

Array clone() const
	{
		Array b(_a, length());
		return b;
	}